

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<float>::AdjustResidual(TPZDohrSubstruct<float> *this,TPZFMatrix<float> *r_global)

{
  int iVar1;
  int iVar2;
  pair<int,_int> *ppVar3;
  TPZMatrix<float> *pTVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  ulong uVar10;
  long lVar11;
  ulong __n;
  TPZFMatrix<float> radjust;
  TPZFMatrix<float> rloc;
  TPZFMatrix<float> radapt;
  TPZFMatrix<float> rint;
  TPZFMatrix<float> local_270;
  TPZFMatrix<float> local_1e0;
  TPZFMatrix<float> local_150;
  TPZFMatrix<float> local_c0;
  
  iVar1 = this->fNEquations;
  lVar7 = (long)iVar1;
  lVar8 = (this->fInternalEqs).fNElements;
  lVar11 = lVar8 << 0x20;
  uVar5 = (uint)lVar8;
  uVar10 = (ulong)(int)uVar5;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_c0.fElem = (float *)0x0;
  local_c0.fGiven = (float *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = uVar10;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_c0.fWork.fStore = (float *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (lVar11 != 0) {
    __n = lVar11 >> 0x1e;
    local_c0.fElem = (float *)operator_new__(-(ulong)(uVar10 >> 0x3e != 0) | __n);
    if (0 < (long)uVar10) {
      memset(local_c0.fElem,0,__n);
    }
  }
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_150.fElem = (float *)0x0;
  local_150.fGiven = (float *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar7;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_150.fWork.fStore = (float *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (iVar1 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar10 = lVar7 * 4;
    }
    local_150.fElem = (float *)operator_new__(uVar10);
    if (0 < iVar1) {
      memset(local_150.fElem,0,lVar7 * 4);
    }
  }
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      lVar8 = (long)(this->fGlobalIndex).fStore[(this->fInternalEqs).fStore[uVar10]];
      if (-1 < lVar8) {
        if ((local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= (long)uVar10) ||
           (local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_c0.fElem[uVar10] = r_global->fElem[lVar8];
      }
      uVar10 = uVar10 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar10);
  }
  uVar6 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar6) {
    uVar10 = 0;
    do {
      ppVar3 = (this->fGlobalEqs).fStore;
      iVar2 = ppVar3[uVar10].first;
      lVar8 = (long)ppVar3[uVar10].second;
      if (((lVar8 < 0) || ((r_global->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow <= lVar8)) ||
         ((r_global->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar2 < 0) || (local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= iVar2)) ||
         (local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_150.fElem[iVar2] = r_global->fElem[lVar8];
      uVar10 = uVar10 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar10);
  }
  TPZStepSolver<float>::Solve
            (&this->fInvertedInternalStiffness,&local_c0,&this->fAdjustSolution,
             (TPZFMatrix<float> *)0x0);
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_1e0.fElem = (float *)0x0;
  local_1e0.fGiven = (float *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar7;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_1e0.fWork.fStore = (float *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  if (iVar1 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar10 = lVar7 * 4;
    }
    local_1e0.fElem = (float *)operator_new__(uVar10);
    if (0 < iVar1) {
      memset(local_1e0.fElem,0,lVar7 * 4);
    }
  }
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_270.fElem = (float *)0x0;
  local_270.fGiven = (float *)0x0;
  local_270.fSize = 0;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar7;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_270.fWork.fStore = (float *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  if (iVar1 != 0) {
    uVar10 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar10 = lVar7 * 4;
    }
    local_270.fElem = (float *)operator_new__(uVar10);
    if (0 < iVar1) {
      memset(local_270.fElem,0,lVar7 * 4);
    }
  }
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      if (((this->fAdjustSolution).super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= (long)uVar10)
         || ((this->fAdjustSolution).super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar8 = (long)(this->fInternalEqs).fStore[uVar10];
      if ((lVar8 < 0) ||
         ((local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar8 ||
          (local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)))) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_1e0.fElem[lVar8] = (this->fAdjustSolution).fElem[uVar10];
      uVar10 = uVar10 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar10);
  }
  pTVar4 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar4->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x27])
            (0xbf800000,0x3f800000,pTVar4,&local_1e0,&local_150,&local_270,0);
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      lVar8 = (long)(this->fInternalEqs).fStore[uVar10];
      if (((lVar8 < 0) || (local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar8)) ||
         (local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (1e-10 <= ABS(local_270.fElem[lVar8])) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Internal node ",0xe);
        poVar9 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," was not zeroed ",0x10);
        lVar8 = (long)(this->fInternalEqs).fStore[uVar10];
        if (((lVar8 < 0) || (local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar8)) ||
           (local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        poVar9 = std::ostream::_M_insert<double>((double)local_270.fElem[lVar8]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      lVar8 = (long)(this->fInternalEqs).fStore[uVar10];
      if (((lVar8 < 0) || (local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar8)) ||
         (local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_270.fElem[lVar8] = 0.0;
      uVar10 = uVar10 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar10);
  }
  if (0 < (int)uVar6) {
    uVar10 = 0;
    do {
      ppVar3 = (this->fGlobalEqs).fStore;
      lVar8 = (long)ppVar3[uVar10].first;
      iVar1 = ppVar3[uVar10].second;
      if (((lVar8 < 0) || (local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar8)) ||
         (local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar1 < 0) ||
          ((r_global->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow <= (long)iVar1)) ||
         ((r_global->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      r_global->fElem[iVar1] = local_270.fElem[lVar8];
      uVar10 = uVar10 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar10);
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_270);
  TPZFMatrix<float>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<float>::~TPZFMatrix(&local_150);
  TPZFMatrix<float>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::AdjustResidual(TPZFMatrix<TVar> &r_global)
{
	int nglob = fNEquations;
	int nint = this->fInternalEqs.NElements();
	TPZFMatrix<TVar> rint(nint,1,0.),radapt(nglob,1,0.);
	int i;
	for(i=0; i<nint; i++)
	{
		if(fGlobalIndex[fInternalEqs[i]] >= 0)
		{
			rint(i,0) = r_global(fGlobalIndex[fInternalEqs[i]]);
		}
	}
	
	// initializar radapt com zero
	int neqs = fGlobalEqs.NElements();
	for(i=0; i<neqs; i++)
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		radapt(ind.first,0) = r_global(ind.second,0);
	}
	fInvertedInternalStiffness.Solve(rint,fAdjustSolution);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Adjusted internal solution";
		fAdjustSolution.Print("fAdjustSolution",sout);
		rint.Print("Internal residual",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	TPZFMatrix<TVar> rloc(nglob,1,0.),radjust(nglob,1,0.);
	for(i=0; i<nint; i++)
	{
		rloc(fInternalEqs[i],0) = fAdjustSolution(i,0);
	}
	fStiffness->MultAdd(rloc,radapt,radjust,-1.,1.);
	for(i=0; i<nint; i++)
	{
		if(fabs(radjust(fInternalEqs[i],0)) >= 1.e-10)
		{
			std::cout << "Internal node " << i << " was not zeroed " << radjust(fInternalEqs[i],0) << std::endl;
		}
		radjust(fInternalEqs[i],0) = 0.;
	}
	
	// somar a contribuicao no r_global (tarefa)
	for(i=0; i<neqs; i++)
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		r_global(ind.second,0) = radjust(ind.first,0);
	}
}